

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_4x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined4 uVar1;
  int iVar2;
  uint8_t *puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i y_select;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar10 [16];
  undefined1 auVar16 [16];
  undefined1 auVar11 [16];
  undefined1 auVar17 [16];
  undefined1 auVar12 [16];
  undefined1 auVar18 [16];
  
  auVar14 = _DAT_004654c0;
  auVar7 = _DAT_004654b0;
  uVar1 = *(undefined4 *)top_row;
  auVar6 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  auVar5[0] = (byte)uVar1;
  auVar5[1] = 0;
  auVar8._0_12_ = ZEXT712(0);
  auVar8[0xc] = (char)((uint)uVar1 >> 0x18);
  auVar8[0xd] = 0;
  auVar8._14_2_ = auVar6._6_2_;
  auVar20._12_4_ = auVar8._12_4_;
  auVar20._0_10_ = (unkuint10)0;
  auVar20._10_2_ = auVar6._4_2_;
  auVar5[9] = 0;
  auVar5[8] = (byte)((uint)uVar1 >> 0x10);
  auVar5._10_6_ = auVar20._10_6_;
  auVar5._6_2_ = auVar6._2_2_;
  auVar5[5] = 0;
  auVar5[4] = (byte)((uint)uVar1 >> 8);
  auVar5._2_2_ = auVar6._0_2_;
  iVar2 = 8;
  puVar3 = dst;
  auVar20 = _DAT_00465450;
  while (auVar6 = _DAT_004654e0, auVar8 = _DAT_004654d0, bVar4 = iVar2 != 0, iVar2 = iVar2 + -1,
        bVar4) {
    auVar8 = pshufb(auVar7,auVar20);
    auVar6 = pshufb(auVar14,auVar20);
    auVar12._0_12_ = auVar8._0_12_;
    auVar12._12_2_ = auVar8._6_2_;
    auVar12._14_2_ = auVar6._6_2_;
    auVar11._12_4_ = auVar12._12_4_;
    auVar11._0_10_ = auVar8._0_10_;
    auVar11._10_2_ = auVar6._4_2_;
    auVar10._10_6_ = auVar11._10_6_;
    auVar10._0_8_ = auVar8._0_8_;
    auVar10._8_2_ = auVar8._4_2_;
    auVar9._8_8_ = auVar10._8_8_;
    auVar9._6_2_ = auVar6._2_2_;
    auVar9._4_2_ = auVar8._2_2_;
    auVar9._0_2_ = auVar8._0_2_;
    auVar9._2_2_ = auVar6._0_2_;
    auVar8 = pmaddwd(auVar9,auVar5);
    auVar13._0_4_ = auVar8._0_4_ + 0x80;
    auVar13._4_4_ = auVar8._4_4_ + 0x80;
    auVar13._8_4_ = auVar8._8_4_ + 0x80;
    auVar13._12_4_ = auVar8._12_4_ + 0x80;
    auVar8 = pshufb(auVar13,ZEXT416(0xd090501));
    *(int *)puVar3 = auVar8._0_4_;
    puVar3 = puVar3 + stride;
    auVar6._0_2_ = auVar20._0_2_ + 0x202;
    auVar6._2_2_ = auVar20._2_2_ + 0x202;
    auVar6._4_2_ = auVar20._4_2_ + 0x202;
    auVar6._6_2_ = auVar20._6_2_ + 0x202;
    auVar6._8_2_ = auVar20._8_2_ + 0x202;
    auVar6._10_2_ = auVar20._10_2_ + 0x202;
    auVar6._12_2_ = auVar20._12_2_ + 0x202;
    auVar6._14_2_ = auVar20._14_2_ + 0x202;
    auVar20 = auVar6;
  }
  puVar3 = dst + stride * 8;
  iVar2 = 8;
  auVar7 = _DAT_00465450;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    auVar14 = pshufb(auVar8,auVar7);
    auVar20 = pshufb(auVar6,auVar7);
    auVar18._0_12_ = auVar14._0_12_;
    auVar18._12_2_ = auVar14._6_2_;
    auVar18._14_2_ = auVar20._6_2_;
    auVar17._12_4_ = auVar18._12_4_;
    auVar17._0_10_ = auVar14._0_10_;
    auVar17._10_2_ = auVar20._4_2_;
    auVar16._10_6_ = auVar17._10_6_;
    auVar16._0_8_ = auVar14._0_8_;
    auVar16._8_2_ = auVar14._4_2_;
    auVar15._8_8_ = auVar16._8_8_;
    auVar15._6_2_ = auVar20._2_2_;
    auVar15._4_2_ = auVar14._2_2_;
    auVar15._0_2_ = auVar14._0_2_;
    auVar15._2_2_ = auVar20._0_2_;
    auVar14 = pmaddwd(auVar15,auVar5);
    auVar19._0_4_ = auVar14._0_4_ + 0x80;
    auVar19._4_4_ = auVar14._4_4_ + 0x80;
    auVar19._8_4_ = auVar14._8_4_ + 0x80;
    auVar19._12_4_ = auVar14._12_4_ + 0x80;
    auVar14 = pshufb(auVar19,ZEXT416(0xd090501));
    *(int *)puVar3 = auVar14._0_4_;
    puVar3 = puVar3 + stride;
    auVar14._0_2_ = auVar7._0_2_ + 0x202;
    auVar14._2_2_ = auVar7._2_2_ + 0x202;
    auVar14._4_2_ = auVar7._4_2_ + 0x202;
    auVar14._6_2_ = auVar7._6_2_ + 0x202;
    auVar14._8_2_ = auVar7._8_2_ + 0x202;
    auVar14._10_2_ = auVar7._10_2_ + 0x202;
    auVar14._12_2_ = auVar7._12_2_ + 0x202;
    auVar14._14_2_ = auVar7._14_2_ + 0x202;
    auVar7 = auVar14;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_4x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  __m128i pixels;
  load_smooth_vertical_pixels4(top_row, left_column, 16, &pixels);

  __m128i weights[4];
  load_smooth_vertical_weights4(smooth_weights, 16, weights);

  write_smooth_vertical4xh(&pixels, weights, 8, dst, stride);
  dst += stride << 3;
  write_smooth_vertical4xh(&pixels, &weights[2], 8, dst, stride);
}